

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDsdGlobal(Abc_Ntk_t *pNtk,int fVerbose,int fPrint,int fShort)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  DdManager *dd;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar4;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                  ,0x45,"Abc_Ntk_t *Abc_NtkDsdGlobal(Abc_Ntk_t *, int, int, int)");
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,fVerbose);
  if (dd != (DdManager *)0x0) {
    iVar3 = 0;
    if (fVerbose != 0) {
      uVar1 = Cudd_ReadKeys(dd);
      uVar2 = Cudd_ReadDead(dd);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar1 - uVar2));
      iVar3 = fVerbose;
    }
    pNtk_00 = Abc_NtkDsdInternal(pNtk,iVar3,fPrint,fShort);
    Extra_StopManager(dd);
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar4 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar4;
      }
      iVar3 = Abc_NtkCheck(pNtk_00);
      if (iVar3 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkDsdGlobal: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkDsdGlobal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort )
{
    DdManager * dd;
    Abc_Ntk_t * pNtkNew;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, fVerbose );
    if ( dd == NULL )
        return NULL;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    // transform the result of mapping into a BDD network
    pNtkNew = Abc_NtkDsdInternal( pNtk, fVerbose, fPrint, fShort );
    Extra_StopManager( dd );
    if ( pNtkNew == NULL )
        return NULL;
    // copy EXDC network
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkDsdGlobal: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}